

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-loop-handles.c
# Opt level: O3

int run_test_loop_handles(void)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  uv_timer_t *puVar4;
  int64_t eval_b;
  int64_t eval_a;
  void *local_18;
  
  uVar2 = uv_default_loop();
  iVar1 = uv_prepare_init(uVar2,&prepare_1_handle);
  local_18 = (void *)(long)iVar1;
  if (local_18 == (void *)0x0) {
    iVar1 = uv_prepare_start(&prepare_1_handle,0);
    if (iVar1 != -0x16) goto LAB_001ac145;
    iVar1 = uv_prepare_start(&prepare_1_handle,prepare_1_cb);
    local_18 = (void *)(long)iVar1;
    if (local_18 != (void *)0x0) goto LAB_001ac14a;
    uVar2 = uv_default_loop();
    iVar1 = uv_check_init(uVar2,&check_handle);
    local_18 = (void *)(long)iVar1;
    if (local_18 != (void *)0x0) goto LAB_001ac159;
    iVar1 = uv_check_start(&check_handle,check_cb);
    local_18 = (void *)(long)iVar1;
    if (local_18 != (void *)0x0) goto LAB_001ac168;
    uVar2 = uv_default_loop();
    iVar1 = uv_prepare_init(uVar2,&prepare_2_handle);
    local_18 = (void *)(long)iVar1;
    if (local_18 != (void *)0x0) goto LAB_001ac177;
    lVar3 = 0;
    do {
      local_18 = (void *)0x0;
      uVar2 = uv_default_loop();
      iVar1 = uv_idle_init(uVar2,(long)&idle_1_handles[0].data + lVar3);
      local_18 = (void *)(long)iVar1;
      if (local_18 != (void *)0x0) {
        run_test_loop_handles_cold_7();
        goto LAB_001ac136;
      }
      lVar3 = lVar3 + 0x58;
    } while (lVar3 != 0x268);
    uVar2 = uv_default_loop();
    iVar1 = uv_timer_init(uVar2,&timer_handle);
    local_18 = (void *)(long)iVar1;
    if (local_18 != (void *)0x0) goto LAB_001ac186;
    iVar1 = uv_timer_start(&timer_handle,timer_cb,100,100);
    local_18 = (void *)(long)iVar1;
    if (local_18 != (void *)0x0) goto LAB_001ac195;
    uv_unref(&timer_handle);
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,0);
    local_18 = (void *)(long)iVar1;
    if (local_18 != (void *)0x0) goto LAB_001ac1a4;
    local_18 = (void *)(long)loop_iteration;
    if (local_18 != (void *)0x15) goto LAB_001ac1b3;
    local_18 = (void *)(long)prepare_1_cb_called;
    if (local_18 != (void *)0x15) goto LAB_001ac1c2;
    local_18 = (void *)0x1;
    if (prepare_1_close_cb_called != 1) goto LAB_001ac1d1;
    local_18 = (void *)(long)prepare_2_cb_called;
    if (local_18 != (void *)0xa) goto LAB_001ac1e0;
    local_18 = (void *)0x1;
    if (prepare_2_close_cb_called != 1) goto LAB_001ac1ef;
    local_18 = (void *)(long)check_cb_called;
    if (local_18 != (void *)0x15) goto LAB_001ac1fe;
    local_18 = (void *)0x1;
    if (check_close_cb_called != 1) goto LAB_001ac20d;
    local_18 = (void *)(long)idle_1_close_cb_called;
    if (local_18 != (void *)0x7) goto LAB_001ac21c;
    local_18 = (void *)(long)idle_2_close_cb_called;
    if (local_18 != (void *)(long)idle_2_cb_started) goto LAB_001ac22b;
    local_18 = (void *)(ulong)idle_2_is_active;
    if (local_18 == (void *)0x0) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      local_18 = (void *)0x0;
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (local_18 == (void *)(long)iVar1) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001ac249;
    }
  }
  else {
LAB_001ac136:
    run_test_loop_handles_cold_1();
LAB_001ac145:
    run_test_loop_handles_cold_2();
LAB_001ac14a:
    run_test_loop_handles_cold_3();
LAB_001ac159:
    run_test_loop_handles_cold_4();
LAB_001ac168:
    run_test_loop_handles_cold_5();
LAB_001ac177:
    run_test_loop_handles_cold_6();
LAB_001ac186:
    run_test_loop_handles_cold_8();
LAB_001ac195:
    run_test_loop_handles_cold_9();
LAB_001ac1a4:
    run_test_loop_handles_cold_10();
LAB_001ac1b3:
    run_test_loop_handles_cold_11();
LAB_001ac1c2:
    run_test_loop_handles_cold_12();
LAB_001ac1d1:
    run_test_loop_handles_cold_13();
LAB_001ac1e0:
    run_test_loop_handles_cold_14();
LAB_001ac1ef:
    run_test_loop_handles_cold_15();
LAB_001ac1fe:
    run_test_loop_handles_cold_16();
LAB_001ac20d:
    run_test_loop_handles_cold_17();
LAB_001ac21c:
    run_test_loop_handles_cold_18();
LAB_001ac22b:
    run_test_loop_handles_cold_19();
  }
  run_test_loop_handles_cold_20();
LAB_001ac249:
  puVar4 = (uv_timer_t *)&stack0xffffffffffffffe8;
  run_test_loop_handles_cold_21();
  if (puVar4 == &timer_handle) {
    return 0x36d938;
  }
  timer_cb_cold_1();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(puVar4,0);
  return iVar1;
}

Assistant:

TEST_IMPL(loop_handles) {
  int i;
  int r;

  r = uv_prepare_init(uv_default_loop(), &prepare_1_handle);
  ASSERT_OK(r);
  r = uv_prepare_start(&prepare_1_handle, NULL);
  ASSERT(r == UV_EINVAL);
  r = uv_prepare_start(&prepare_1_handle, prepare_1_cb);
  ASSERT_OK(r);

  r = uv_check_init(uv_default_loop(), &check_handle);
  ASSERT_OK(r);
  r = uv_check_start(&check_handle, check_cb);
  ASSERT_OK(r);

  /* initialize only, prepare_2 is started by prepare_1_cb */
  r = uv_prepare_init(uv_default_loop(), &prepare_2_handle);
  ASSERT_OK(r);

  for (i = 0; i < IDLE_COUNT; i++) {
    /* initialize only, idle_1 handles are started by check_cb */
    r = uv_idle_init(uv_default_loop(), &idle_1_handles[i]);
    ASSERT_OK(r);
  }

  /* don't init or start idle_2, both is done by idle_1_cb */

  /* The timer callback is there to keep the event loop polling unref it as it
   * is not supposed to keep the loop alive */
  r = uv_timer_init(uv_default_loop(), &timer_handle);
  ASSERT_OK(r);
  r = uv_timer_start(&timer_handle, timer_cb, TIMEOUT, TIMEOUT);
  ASSERT_OK(r);
  uv_unref((uv_handle_t*)&timer_handle);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(loop_iteration, ITERATIONS);

  ASSERT_EQ(prepare_1_cb_called, ITERATIONS);
  ASSERT_EQ(1, prepare_1_close_cb_called);

  ASSERT_EQ(prepare_2_cb_called, ITERATIONS / 2);
  ASSERT_EQ(1, prepare_2_close_cb_called);

  ASSERT_EQ(check_cb_called, ITERATIONS);
  ASSERT_EQ(1, check_close_cb_called);

  /* idle_1_cb should be called a lot */
  ASSERT_EQ(idle_1_close_cb_called, IDLE_COUNT);

  ASSERT_EQ(idle_2_close_cb_called, idle_2_cb_started);
  ASSERT_OK(idle_2_is_active);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}